

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitivesGeneratedQueryCase::iterate
          (PrimitivesGeneratedQueryCase *this)

{
  ObjectTraits **ppOVar1;
  TestContext *this_00;
  GLuint GVar2;
  int iVar3;
  undefined4 uVar4;
  deUint32 dVar5;
  undefined4 extraout_var;
  GLuint GVar7;
  GLuint primitivesGenerated;
  Query query;
  Buffer buffer;
  VertexArray vao;
  long lVar6;
  
  primitivesGenerated = 0xdebadbad;
  vao.super_ObjectWrapper.m_gl =
       (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppOVar1 = &vao.super_ObjectWrapper.m_traits;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
  std::operator<<((ostream *)ppOVar1,
                  "Drawing 8 points, setting a_one for each to value (1.0, 1.0, 1.0, 1.0)");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&vao,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
  if (Functional::(anonymous_namespace)::PrimitivesGeneratedQueryCase::iterate()::vertexData == '\0'
     ) {
    iVar3 = __cxa_guard_acquire(&Functional::(anonymous_namespace)::PrimitivesGeneratedQueryCase::
                                 iterate()::vertexData);
    if (iVar3 != 0) {
      iterate::vertexData[0].m_data[0] = (float)DAT_01685170;
      iterate::vertexData[0].m_data[1] = DAT_01685170._4_4_;
      iterate::vertexData[0].m_data[2] = (float)DAT_01685178;
      iterate::vertexData[0].m_data[3] = DAT_01685178._4_4_;
      iterate::vertexData[1].m_data[0] = _DAT_01675840;
      iterate::vertexData[1].m_data[1] = _UNK_01675844;
      iterate::vertexData[1].m_data[2] = _UNK_01675848;
      iterate::vertexData[1].m_data[3] = _UNK_0167584c;
      iterate::vertexData[2].m_data[0] = _DAT_01886d10;
      iterate::vertexData[2].m_data[1] = _UNK_01886d14;
      iterate::vertexData[2].m_data[2] = _UNK_01886d18;
      iterate::vertexData[2].m_data[3] = _UNK_01886d1c;
      iterate::vertexData[3].m_data[0] = _DAT_01675840;
      iterate::vertexData[3].m_data[1] = _UNK_01675844;
      iterate::vertexData[3].m_data[2] = _UNK_01675848;
      iterate::vertexData[3].m_data[3] = _UNK_0167584c;
      iterate::vertexData[4].m_data[0] = _DAT_01886d20;
      iterate::vertexData[4].m_data[1] = _UNK_01886d24;
      iterate::vertexData[4].m_data[2] = _UNK_01886d28;
      iterate::vertexData[4].m_data[3] = _UNK_01886d2c;
      iterate::vertexData[5].m_data[0] = _DAT_01675840;
      iterate::vertexData[5].m_data[1] = _UNK_01675844;
      iterate::vertexData[5].m_data[2] = _UNK_01675848;
      iterate::vertexData[5].m_data[3] = _UNK_0167584c;
      iterate::vertexData[6].m_data[0] = _DAT_01886d30;
      iterate::vertexData[6].m_data[1] = _UNK_01886d34;
      iterate::vertexData[6].m_data[2] = _UNK_01886d38;
      iterate::vertexData[6].m_data[3] = _UNK_01886d3c;
      iterate::vertexData[7].m_data[0] = _DAT_01675840;
      iterate::vertexData[7].m_data[1] = _UNK_01675844;
      iterate::vertexData[7].m_data[2] = _UNK_01675848;
      iterate::vertexData[7].m_data[3] = _UNK_0167584c;
      iterate::vertexData[8].m_data[0] = _DAT_01886d40;
      iterate::vertexData[8].m_data[1] = _UNK_01886d44;
      iterate::vertexData[8].m_data[2] = _UNK_01886d48;
      iterate::vertexData[8].m_data[3] = _UNK_01886d4c;
      iterate::vertexData[9].m_data[0] = _DAT_01675840;
      iterate::vertexData[9].m_data[1] = _UNK_01675844;
      iterate::vertexData[9].m_data[2] = _UNK_01675848;
      iterate::vertexData[9].m_data[3] = _UNK_0167584c;
      iterate::vertexData[10].m_data[0] = _DAT_01732910;
      iterate::vertexData[10].m_data[1] = _UNK_01732914;
      iterate::vertexData[10].m_data[2] = _UNK_01732918;
      iterate::vertexData[10].m_data[3] = _UNK_0173291c;
      iterate::vertexData[0xb].m_data[0] = _DAT_01675840;
      iterate::vertexData[0xb].m_data[1] = _UNK_01675844;
      iterate::vertexData[0xb].m_data[2] = _UNK_01675848;
      iterate::vertexData[0xb].m_data[3] = _UNK_0167584c;
      iterate::vertexData[0xc].m_data[0] = _DAT_01825da0;
      iterate::vertexData[0xc].m_data[1] = _UNK_01825da4;
      iterate::vertexData[0xc].m_data[2] = _UNK_01825da8;
      iterate::vertexData[0xc].m_data[3] = _UNK_01825dac;
      iterate::vertexData[0xd].m_data[0] = _DAT_01675840;
      iterate::vertexData[0xd].m_data[1] = _UNK_01675844;
      iterate::vertexData[0xd].m_data[2] = _UNK_01675848;
      iterate::vertexData[0xd].m_data[3] = _UNK_0167584c;
      iterate::vertexData[0xe].m_data[0] = _DAT_01886d50;
      iterate::vertexData[0xe].m_data[1] = _UNK_01886d54;
      iterate::vertexData[0xe].m_data[2] = _UNK_01886d58;
      iterate::vertexData[0xe].m_data[3] = _UNK_01886d5c;
      iterate::vertexData[0xf].m_data[0] = _DAT_01675840;
      iterate::vertexData[0xf].m_data[1] = _UNK_01675844;
      iterate::vertexData[0xf].m_data[2] = _UNK_01675848;
      iterate::vertexData[0xf].m_data[3] = _UNK_0167584c;
      __cxa_guard_release(&Functional::(anonymous_namespace)::PrimitivesGeneratedQueryCase::
                           iterate()::vertexData);
    }
  }
  iVar3 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar3);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            (&vao,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&buffer,((this->super_TestCase).m_context)->m_renderCtx);
  glu::TypedObjectWrapper<(glu::ObjectType)6>::TypedObjectWrapper
            (&query,((this->super_TestCase).m_context)->m_renderCtx);
  uVar4 = (**(code **)(lVar6 + 0x780))((this->m_program->m_program).m_program,"a_position");
  iVar3 = (**(code **)(lVar6 + 0x780))((this->m_program->m_program).m_program,"a_one");
  (**(code **)(lVar6 + 0xd8))(vao.super_ObjectWrapper.m_object);
  (**(code **)(lVar6 + 0x40))(0x8892,buffer.super_ObjectWrapper.m_object);
  (**(code **)(lVar6 + 0x150))(0x8892,0x100,iterate::vertexData,0x88e4);
  (**(code **)(lVar6 + 0x19f0))(uVar4,4,0x1406,0,0x20,0);
  (**(code **)(lVar6 + 0x610))(uVar4);
  if (iVar3 != -1) {
    (**(code **)(lVar6 + 0x19f0))(iVar3,4,0x1406,0,0x20,0x10);
    (**(code **)(lVar6 + 0x610))(iVar3);
  }
  (**(code **)(lVar6 + 0x1680))((this->m_program->m_program).m_program);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"setup render",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1288);
  (**(code **)(lVar6 + 0x20))(0x8c87,query.super_ObjectWrapper.m_object);
  (**(code **)(lVar6 + 0x538))(0,0,8);
  (**(code **)(lVar6 + 0x628))(0x8c87);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"render and query",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x128e);
  (**(code **)(lVar6 + 0xa20))(query.super_ObjectWrapper.m_object,0x8866,&primitivesGenerated);
  dVar5 = (**(code **)(lVar6 + 0x800))();
  glu::checkError(dVar5,"get query result",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fGeometryShaderTests.cpp"
                  ,0x1291);
  glu::ObjectWrapper::~ObjectWrapper(&query.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&buffer.super_ObjectWrapper);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  vao.super_ObjectWrapper.m_gl =
       (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  ppOVar1 = &vao.super_ObjectWrapper.m_traits;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
  std::operator<<((ostream *)ppOVar1,"GL_PRIMITIVES_GENERATED = ");
  std::ostream::_M_insert<unsigned_long>((ulong)ppOVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&vao,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
  GVar2 = 8;
  if (this->m_test == TEST_INSTANCED) {
    GVar2 = 0x20;
  }
  GVar7 = 0x18;
  if (this->m_test != TEST_AMPLIFICATION) {
    GVar7 = GVar2;
  }
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  if (GVar7 == primitivesGenerated) {
    tcu::TestContext::setTestResult(this_00,QP_TEST_RESULT_PASS,"Pass");
  }
  else {
    tcu::TestContext::setTestResult
              (this_00,QP_TEST_RESULT_FAIL,"got wrong result for GL_PRIMITIVES_GENERATED");
    vao.super_ObjectWrapper.m_gl =
         (Functions *)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    ppOVar1 = &vao.super_ObjectWrapper.m_traits;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)ppOVar1);
    std::operator<<((ostream *)ppOVar1,
                    "Got unexpected result for GL_PRIMITIVES_GENERATED. Expected ");
    std::ostream::_M_insert<unsigned_long>((ulong)ppOVar1);
    std::operator<<((ostream *)ppOVar1,", got ");
    std::ostream::_M_insert<unsigned_long>((ulong)ppOVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&vao,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)ppOVar1);
  }
  return STOP;
}

Assistant:

PrimitivesGeneratedQueryCase::IterateResult PrimitivesGeneratedQueryCase::iterate (void)
{
	glw::GLuint primitivesGenerated = 0xDEBADBAD;

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Drawing 8 points, setting a_one for each to value (1.0, 1.0, 1.0, 1.0)"
		<< tcu::TestLog::EndMessage;

	{
		static const tcu::Vec4 vertexData[8*2] =
		{
			tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.1f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.2f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.3f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.4f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.5f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.6f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
			tcu::Vec4(0.7f, 0.0f, 0.0f, 1.0f),	tcu::Vec4(1.0f, 1.0f, 1.0f, 1.0f),
		};

		const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
		const glu::VertexArray	vao					(m_context.getRenderContext());
		const glu::Buffer		buffer				(m_context.getRenderContext());
		const glu::Query		query				(m_context.getRenderContext());
		const int				positionLocation	= gl.getAttribLocation(m_program->getProgram(), "a_position");
		const int				oneLocation			= gl.getAttribLocation(m_program->getProgram(), "a_one");

		gl.bindVertexArray(*vao);

		gl.bindBuffer(GL_ARRAY_BUFFER, *buffer);
		gl.bufferData(GL_ARRAY_BUFFER, (int)sizeof(vertexData), vertexData, GL_STATIC_DRAW);

		gl.vertexAttribPointer(positionLocation, 4, GL_FLOAT, GL_FALSE, 2 * (int)sizeof(tcu::Vec4), DE_NULL);
		gl.enableVertexAttribArray(positionLocation);

		if (oneLocation != -1)
		{
			gl.vertexAttribPointer(oneLocation, 4, GL_FLOAT, GL_FALSE, 2 * (int)sizeof(tcu::Vec4), (const tcu::Vec4*)DE_NULL + 1);
			gl.enableVertexAttribArray(oneLocation);
		}

		gl.useProgram(m_program->getProgram());

		GLU_EXPECT_NO_ERROR(gl.getError(), "setup render");

		gl.beginQuery(GL_PRIMITIVES_GENERATED, *query);
		gl.drawArrays(GL_POINTS, 0, 8);
		gl.endQuery(GL_PRIMITIVES_GENERATED);

		GLU_EXPECT_NO_ERROR(gl.getError(), "render and query");

		gl.getQueryObjectuiv(*query, GL_QUERY_RESULT, &primitivesGenerated);
		GLU_EXPECT_NO_ERROR(gl.getError(), "get query result");
	}

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "GL_PRIMITIVES_GENERATED = " << primitivesGenerated
		<< tcu::TestLog::EndMessage;

	{
		const deUint32 expectedGenerated = (m_test == TEST_AMPLIFICATION) ? (3*8) : (m_test == TEST_INSTANCED) ? (8*(3+1)) : (8);

		if (expectedGenerated == primitivesGenerated)
			m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got wrong result for GL_PRIMITIVES_GENERATED");
			m_testCtx.getLog()
				<< tcu::TestLog::Message
				<< "Got unexpected result for GL_PRIMITIVES_GENERATED. Expected " << expectedGenerated << ", got " << primitivesGenerated
				<< tcu::TestLog::EndMessage;
		}
	}

	return STOP;
}